

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O2

void __thiscall read_node_v8::operator()(read_node_v8 *this,ai_node *node,xr_reader *r)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  uint32_t uVar3;
  
  xray_re::xr_reader::r_cseq<unsigned_char>(r,0xc,node->data);
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar1 = *puVar2;
  node->cover = uVar1;
  node->low_cover = uVar1;
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  node->plane = *puVar2;
  uVar3 = xray_re::xr_reader::r_u24(r);
  node->packed_xz = uVar3;
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  node->packed_y = *puVar2;
  return;
}

Assistant:

void operator()(ai_node& node, xr_reader& r) const {
	r.r_cseq(12, node.data);
	node.low_cover = node.cover = r.r_u16();
	node.plane = r.r_u16();
	node.packed_xz = r.r_u24();
	node.packed_y = r.r_u16();
}